

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O2

void merge_2way(uchar **from0,size_t n0,uchar **from1,size_t n1,uchar **result)

{
  uint __line;
  int iVar1;
  uchar **__dest;
  uchar *puVar2;
  uchar **__src;
  char *__assertion;
  size_t sVar3;
  uchar *puVar4;
  uchar **local_38;
  
  if (n0 == 0) {
    __assertion = "n0";
  }
  else {
    if (n1 != 0) {
      if (result == (uchar **)0x0) {
        __assertion = "result";
        __line = 0x47;
      }
      else {
        puVar2 = *from0;
        if (puVar2 == (uchar *)0x0) {
          __assertion = "key0";
        }
        else {
          puVar4 = *from1;
          local_38 = from0;
          if (puVar4 != (uchar *)0x0) {
            while( true ) {
              while( true ) {
                __dest = result + 1;
                iVar1 = cmp(puVar2,puVar4);
                if (0 < iVar1) break;
                *result = puVar2;
                sVar3 = n0 - 1;
                __src = from1;
                n0 = n1;
                if (sVar3 == 0) goto LAB_001ba033;
                puVar2 = local_38[1];
                local_38 = local_38 + 1;
                result = __dest;
                n0 = sVar3;
              }
              *result = puVar4;
              __src = local_38;
              if (n1 == 1) break;
              puVar4 = from1[1];
              from1 = from1 + 1;
              n1 = n1 - 1;
              result = __dest;
            }
LAB_001ba033:
            memcpy(__dest,__src,n0 << 3);
            return;
          }
          __assertion = "key1";
        }
        __line = 0x48;
      }
      goto LAB_001ba0b3;
    }
    __assertion = "n1";
  }
  __line = 0x46;
LAB_001ba0b3:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,__line,
                "void merge_2way(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
               );
}

Assistant:

static void
merge_2way(unsigned char** restrict from0, size_t n0,
           unsigned char** restrict from1, size_t n1,
           unsigned char** restrict result)
{
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<"\n";
	unsigned char* key0 = *from0;
	unsigned char* key1 = *from1;
	assert(n0); assert(n1);
	assert(from0); assert(from1); assert(result);
	assert(key0); assert(key1);
	while (true) {
		if (cmp(key0, key1) <= 0) {
			*result++ = key0;
			if (--n0 == 0) goto finish0;
			++from0;
			key0 = *from0;
		} else {
			*result++ = key1;
			if (--n1 == 0) goto finish1;
			++from1;
			key1 = *from1;
		}
	}
finish0:
	assert(n0 == 0);
	assert(n1 > 0);
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<"\n";
	(void) memcpy(result, from1, n1*sizeof(unsigned char*));
	return;
finish1:
	assert(n1 == 0);
	assert(n0 > 0);
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<"\n";
	(void) memcpy(result, from0, n0*sizeof(unsigned char*));
	return;
}